

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

string * __thiscall helics::InputInfo::getTargets_abi_cxx11_(InputInfo *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  sourceInformation *src;
  const_iterator __end4;
  const_iterator __begin4;
  vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
  *__range4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  _Alloc_hider in_stack_ffffffffffffffb8;
  __normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
  local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  cVar4 = (char)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4e185f);
  if ((bVar1) &&
     (bVar1 = std::
              vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
              ::empty((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                       *)in_RDI), !bVar1)) {
    sVar2 = std::
            vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
            ::size((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                    *)(in_RDI + 7));
    if (sVar2 == 1) {
      std::
      vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
      ::front((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
               *)in_stack_ffffffffffffff90);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_RDI,cVar4);
      local_10 = in_RDI + 7;
      local_18._M_current =
           (sourceInformation *)
           std::
           vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
           ::begin((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                    *)in_stack_ffffffffffffff88);
      std::
      vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
      ::end((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
             *)in_stack_ffffffffffffff88);
      while (bVar1 = __gnu_cxx::
                     operator==<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                               ((__normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                                 *)in_stack_ffffffffffffff90,
                                (__normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                                 *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
        ::operator*(&local_18);
        in_stack_ffffffffffffff90 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &in_RDI[0xb]._M_string_length;
        __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &stack0xffffffffffffffb8;
        generateJsonQuotedString((string *)in_stack_ffffffffffffffb8._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (in_RDI,__str);
        cVar4 = (char)((ulong)__str >> 0x38);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff90);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(in_RDI,cVar4);
        __gnu_cxx::
        __normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
        ::operator++(&local_18);
      }
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back(in_stack_ffffffffffffff90);
      *pvVar3 = ']';
    }
  }
  return (string *)&in_RDI[0xb]._M_string_length;
}

Assistant:

const std::string& InputInfo::getTargets() const
{
    if (sourceTargets.empty()) {
        if (!source_info.empty()) {
            if (source_info.size() == 1) {
                sourceTargets = source_info.front().key;
            } else {
                sourceTargets.push_back('[');
                for (const auto& src : source_info) {
                    sourceTargets.append(generateJsonQuotedString(src.key));
                    sourceTargets.push_back(',');
                }
                sourceTargets.back() = ']';
            }
        }
    }
    return sourceTargets;
}